

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplers.cpp
# Opt level: O0

void __thiscall pbrt::MLTSampler::Reject(MLTSampler *this)

{
  iterator pPVar1;
  long in_RDI;
  PrimarySample *X_i;
  iterator __end1;
  iterator __begin1;
  vector<pbrt::MLTSampler::PrimarySample,_pstd::pmr::polymorphic_allocator<pbrt::MLTSampler::PrimarySample>_>
  *__range1;
  PrimarySample *local_18;
  
  local_18 = pstd::
             vector<pbrt::MLTSampler::PrimarySample,_pstd::pmr::polymorphic_allocator<pbrt::MLTSampler::PrimarySample>_>
             ::begin((vector<pbrt::MLTSampler::PrimarySample,_pstd::pmr::polymorphic_allocator<pbrt::MLTSampler::PrimarySample>_>
                      *)(in_RDI + 0x28));
  pPVar1 = pstd::
           vector<pbrt::MLTSampler::PrimarySample,_pstd::pmr::polymorphic_allocator<pbrt::MLTSampler::PrimarySample>_>
           ::end((vector<pbrt::MLTSampler::PrimarySample,_pstd::pmr::polymorphic_allocator<pbrt::MLTSampler::PrimarySample>_>
                  *)(in_RDI + 0x28));
  for (; local_18 != pPVar1; local_18 = local_18 + 1) {
    if (local_18->lastModificationIteration == *(long *)(in_RDI + 0x48)) {
      PrimarySample::Restore(local_18);
    }
  }
  *(long *)(in_RDI + 0x48) = *(long *)(in_RDI + 0x48) + -1;
  return;
}

Assistant:

PBRT_CPU_GPU void MLTSampler::Reject() {
    for (auto &X_i : X)
        if (X_i.lastModificationIteration == currentIteration)
            X_i.Restore();
    --currentIteration;
}